

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetScrollFromPosY(ImGuiWindow *window,float param_2,float center_y_ratio)

{
  float fVar1;
  float fVar2;
  
  fVar1 = ImGuiWindow::TitleBarHeight(window);
  fVar2 = ImGuiWindow::MenuBarHeight(window);
  (window->ScrollTarget).y = (float)(int)((param_2 - (fVar2 + fVar1)) + (window->Scroll).y);
  (window->ScrollTargetCenterRatio).y = center_y_ratio;
  return;
}

Assistant:

void ImGui::SetScrollFromPosY(ImGuiWindow* window, float local_y, float center_y_ratio)
{
    // We store a target position so centering can occur on the next frame when we are guaranteed to have a known window size
    IM_ASSERT(center_y_ratio >= 0.0f && center_y_ratio <= 1.0f);
    const float decoration_up_height = window->TitleBarHeight() + window->MenuBarHeight();
    local_y -= decoration_up_height;
    window->ScrollTarget.y = IM_FLOOR(local_y + window->Scroll.y);
    window->ScrollTargetCenterRatio.y = center_y_ratio;
}